

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_gather.cpp
# Opt level: O0

void duckdb::TemplatedHeapGather<int>
               (Vector *v,idx_t count,SelectionVector *sel,data_ptr_t *key_locations)

{
  int iVar1;
  int *piVar2;
  idx_t iVar3;
  long in_RCX;
  SelectionVector *in_RDX;
  ulong in_RSI;
  idx_t col_idx;
  idx_t i;
  int *target;
  ulong local_30;
  
  piVar2 = FlatVector::GetData<int>((Vector *)0x159b032);
  for (local_30 = 0; local_30 < in_RSI; local_30 = local_30 + 1) {
    iVar3 = SelectionVector::get_index(in_RDX,local_30);
    iVar1 = Load<int>(*(const_data_ptr_t *)(in_RCX + local_30 * 8));
    piVar2[iVar3] = iVar1;
    *(long *)(in_RCX + local_30 * 8) = *(long *)(in_RCX + local_30 * 8) + 4;
  }
  return;
}

Assistant:

static void TemplatedHeapGather(Vector &v, const idx_t count, const SelectionVector &sel, data_ptr_t *key_locations) {
	auto target = FlatVector::GetData<T>(v);

	for (idx_t i = 0; i < count; ++i) {
		const auto col_idx = sel.get_index(i);
		target[col_idx] = Load<T>(key_locations[i]);
		key_locations[i] += sizeof(T);
	}
}